

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

SPARSE_TEXTURE_FLAGS
Diligent::VkSparseImageFormatFlagsToSparseTextureFlags(VkSparseImageFormatFlags Flags)

{
  uint uVar1;
  SPARSE_TEXTURE_FLAGS SVar2;
  string msg;
  string local_50;
  
  SVar2 = SPARSE_TEXTURE_FLAG_NONE;
  while (Flags != 0) {
    uVar1 = -Flags & Flags;
    Flags = Flags ^ uVar1;
    if (uVar1 == 4) {
      SVar2 = SVar2 | SPARSE_TEXTURE_FLAG_LAST;
    }
    else if (uVar1 == 2) {
      SVar2 = SVar2 | SPARSE_TEXTURE_FLAG_ALIGNED_MIP_SIZE;
    }
    else if (uVar1 == 1) {
      SVar2 = SVar2 | SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL;
    }
    else {
      FormatString<char[36]>(&local_50,(char (*) [36])"Unexpected sparse image format flag");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"VkSparseImageFormatFlagsToSparseTextureFlags",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x838);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return SVar2;
}

Assistant:

SPARSE_TEXTURE_FLAGS VkSparseImageFormatFlagsToSparseTextureFlags(VkSparseImageFormatFlags Flags)
{
    SPARSE_TEXTURE_FLAGS Result = SPARSE_TEXTURE_FLAG_NONE;
    while (Flags != 0)
    {
        VkSparseImageFormatFlagBits FlagBit = static_cast<VkSparseImageFormatFlagBits>(ExtractLSB(Flags));
        static_assert(SPARSE_TEXTURE_FLAG_LAST == (1u << 2), "This function must be updated to handle new sparse texture flag");
        switch (FlagBit)
        {
            // clang-format off
            case VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT:         Result |= SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL;         break;
            case VK_SPARSE_IMAGE_FORMAT_ALIGNED_MIP_SIZE_BIT:       Result |= SPARSE_TEXTURE_FLAG_ALIGNED_MIP_SIZE;       break;
            case VK_SPARSE_IMAGE_FORMAT_NONSTANDARD_BLOCK_SIZE_BIT: Result |= SPARSE_TEXTURE_FLAG_NONSTANDARD_BLOCK_SIZE; break;
            // clang-format on
            default:
                UNEXPECTED("Unexpected sparse image format flag");
        }
    }
    return Result;
}